

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Cast * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::doCast<wasm::RefCast>
          (Cast *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          RefCast *curr)

{
  char **this_00;
  bool bVar1;
  Literal *pLVar2;
  HeapType left;
  HeapType right;
  Literal *this_01;
  Flow local_1d8;
  Flow local_190;
  undefined1 local_148 [8];
  Flow ref;
  Literal local_e8;
  Literal local_d0;
  Literal local_b8;
  Literal local_a0;
  Literal local_88;
  Literal local_70;
  Literal local_58;
  undefined1 local_40 [8];
  Literal val;
  Type castType;
  
  visit((Flow *)local_148,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    pLVar2 = Flow::getSingleValue((Flow *)local_148);
    Literal::Literal((Literal *)local_40,pLVar2);
    val.type.id = (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.
                  id;
    this_00 = &val.field_0.func.super_IString.str._M_str;
    bVar1 = wasm::Type::isNull((Type *)this_00);
    if (bVar1) {
      bVar1 = wasm::Type::isNullable(&val.type);
      if (bVar1) {
        Literal::Literal(&local_a0,(Literal *)local_40);
        this_01 = (Literal *)&ref.breakTo.super_IString.str._M_str;
        pLVar2 = &local_a0;
        Literal::Literal(this_01,pLVar2);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
        ::_Variant_storage<1ul,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_01);
      }
      else {
        Literal::Literal(&local_88,(Literal *)local_40);
        this_01 = &local_e8;
        pLVar2 = &local_88;
        Literal::Literal(this_01,pLVar2);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
        ::_Variant_storage<2ul,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_01);
      }
    }
    else {
      left = wasm::Type::getHeapType((Type *)this_00);
      right = wasm::Type::getHeapType(&val.type);
      bVar1 = HeapType::isSubType(left,right);
      if (bVar1) {
        Literal::Literal(&local_70,(Literal *)local_40);
        this_01 = &local_d0;
        pLVar2 = &local_70;
        Literal::Literal(this_01,pLVar2);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
        ::_Variant_storage<1ul,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_01);
      }
      else {
        Literal::Literal(&local_58,(Literal *)local_40);
        this_01 = &local_b8;
        pLVar2 = &local_58;
        Literal::Literal(this_01,pLVar2);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
        ::_Variant_storage<2ul,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_01);
      }
    }
    Literal::~Literal(this_01);
    Literal::~Literal(pLVar2);
    Literal::~Literal((Literal *)local_40);
  }
  else {
    Flow::Flow(&local_190,(Flow *)local_148);
    Flow::Flow(&local_1d8,&local_190);
    std::__detail::__variant::
    _Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
    ::_Variant_storage<0ul,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking&>
              ((_Variant_storage<false,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success,wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                *)__return_storage_ptr__,&local_1d8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_1d8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_190);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Cast doCast(T* curr) {
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return typename Cast::Breaking{ref};
    }
    Literal val = ref.getSingleValue();
    Type castType = curr->getCastType();
    if (val.isNull()) {
      if (castType.isNullable()) {
        return typename Cast::Success{val};
      } else {
        return typename Cast::Failure{val};
      }
    }
    if (HeapType::isSubType(val.type.getHeapType(), castType.getHeapType())) {
      return typename Cast::Success{val};
    } else {
      return typename Cast::Failure{val};
    }
  }